

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBStream *b,uchar splitChar)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_71;
  CBString sc;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  CBString::CBString(&sc,splitChar);
  iVar1 = bssplitscb(b->m_s,&sc.super_tagbstring,streamSplitCb,this);
  if (-1 < iVar1) {
    CBString::~CBString(&sc);
    return;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Split bstream failure",&local_71);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBStringList::split (const CBStream& b, unsigned char splitChar) {
CBString sc (splitChar);
	if (0 > bssplitscb (b.m_s, (bstring) &sc,
	                    streamSplitCb, (void *) this)) {
		bstringThrow ("Split bstream failure");
	}
}